

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,Track *pTrack,longlong time_ns)

{
  int iVar1;
  long lVar2;
  Block *this_00;
  BlockEntry *pBVar3;
  long lVar4;
  BlockEntry *pBVar5;
  long len;
  longlong pos;
  BlockEntry *local_60;
  BlockEntry *local_58;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  if (pTrack == (Track *)0x0) {
    __assert_fail("pTrack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cfd,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const");
  }
  local_58 = &(pTrack->m_eos).super_BlockEntry;
  pBVar3 = local_58;
  if (this->m_pSegment != (Segment *)0x0) {
    lVar4 = 0;
    do {
      if (this->m_entries_count <= lVar4) {
        lVar2 = Parse(this,&local_38,&local_40);
        if (lVar2 < 0) {
          __assert_fail("status >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d0c,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                       );
        }
        pBVar3 = local_58;
        if (lVar2 == 0) {
          if (this->m_entries == (BlockEntry **)0x0) {
            __assert_fail("m_entries",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1d14,
                          "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                         );
          }
          pBVar3 = local_60;
          if (this->m_entries_count <= lVar4) {
            __assert_fail("index < m_entries_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1d15,
                          "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                         );
          }
        }
        local_60 = pBVar3;
        if (lVar2 != 0) {
          return pBVar3;
        }
      }
      pBVar3 = this->m_entries[lVar4];
      if (pBVar3 == (BlockEntry *)0x0) {
        __assert_fail("pEntry",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d19,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      iVar1 = (*pBVar3->_vptr_BlockEntry[3])(pBVar3);
      if (iVar1 == 0) {
        __assert_fail("!pEntry->EOS()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d1a,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      iVar1 = (*pBVar3->_vptr_BlockEntry[2])(pBVar3);
      this_00 = (Block *)CONCAT44(extraout_var,iVar1);
      if (this_00 == (Block *)0x0) {
        __assert_fail("pBlock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d1d,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      if (this_00->m_track == (pTrack->m_info).number) {
        iVar1 = (*pTrack->_vptr_Track[2])(pTrack,pBVar3);
        if ((char)iVar1 == '\0') {
          pBVar5 = local_58;
          if (-1 < time_ns) {
            lVar2 = Block::GetTime(this_00,this);
            pBVar3 = local_58;
            goto joined_r0x001138fd;
          }
LAB_00113916:
          lVar4 = lVar4 + 1;
          iVar1 = 0;
          pBVar3 = local_60;
          local_58 = pBVar5;
        }
        else {
          iVar1 = 1;
          if (-1 < time_ns) {
            lVar2 = Block::GetTime(this_00,this);
joined_r0x001138fd:
            iVar1 = 1;
            pBVar5 = pBVar3;
            pBVar3 = local_58;
            if (lVar2 <= time_ns) goto LAB_00113916;
          }
        }
      }
      else {
        lVar4 = lVar4 + 1;
        iVar1 = 3;
        pBVar3 = local_60;
      }
      local_60 = pBVar3;
    } while ((iVar1 == 0) || (pBVar3 = local_60, iVar1 == 3));
  }
  local_60 = pBVar3;
  return local_60;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const Track* pTrack,
                                    long long time_ns) const {
  assert(pTrack);

  if (m_pSegment == NULL)  // this is the special EOS cluster
    return pTrack->GetEOS();

  const BlockEntry* pResult = pTrack->GetEOS();

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);
      assert(status >= 0);

      if (status > 0)  // completely parsed, and no more entries
        return pResult;

      if (status < 0)  // should never happen
        return 0;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != pTrack->GetNumber()) {
      ++index;
      continue;
    }

    if (pTrack->VetEntry(pEntry)) {
      if (time_ns < 0)  // just want first candidate block
        return pEntry;

      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;

      pResult = pEntry;  // have a candidate
    } else if (time_ns >= 0) {
      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;
    }

    ++index;
  }
}